

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O0

void __thiscall EditDistance::updateDpMatrix(EditDistance *this,int upperBound)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int in_ESI;
  IntView<0> *in_RDI;
  int j;
  int endCol;
  int startCol;
  int i_1;
  int d;
  int i;
  int possible_0_deletes;
  int possible_0_inserts;
  int in_stack_00000064;
  int in_stack_00000068;
  int in_stack_0000006c;
  EditDistance *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_38;
  int local_34;
  int local_30;
  int local_2c [3];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_14 = 0;
  local_c = in_ESI;
  for (local_18 = 0; local_18 < *(int *)&in_RDI[5].var; local_18 = local_18 + 1) {
    bVar1 = IntView<0>::indomain
                      (in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      local_10 = local_10 + 1;
    }
    bVar1 = IntView<0>::indomain
                      (in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      local_14 = local_14 + 1;
    }
  }
  iVar2 = local_c / in_RDI[1].b;
  piVar3 = std::max<int>(&local_10,&local_14);
  local_1c = iVar2 + *piVar3;
  for (local_20 = 0; local_20 < *(int *)&in_RDI[5].var + 1; local_20 = local_20 + 1) {
    local_2c[1] = 0;
    local_2c[0] = local_20 - local_1c;
    piVar3 = std::max<int>(local_2c + 1,local_2c);
    local_2c[2] = *piVar3;
    local_34 = local_20 + local_1c;
    piVar3 = std::min<int>((int *)(in_RDI + 5),&local_34);
    local_30 = *piVar3;
    for (local_38 = local_2c[2]; local_38 < local_30 + 1; local_38 = local_38 + 1) {
      updateDpPosition(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000064);
    }
  }
  return;
}

Assistant:

void updateDpMatrix(int upperBound) {
		//
		// First update regular matrix
		//

		// count num possible 0 insertions
		int possible_0_inserts = 0;
		int possible_0_deletes = 0;
		for (int i = 0; i < seqSize; i++) {
			if (seq1[i].indomain(0)) {
				possible_0_inserts++;
			}
			if (seq2[i].indomain(0)) {
				possible_0_deletes++;
			}
		}

		// d = distance to diagonal that should be calculated in the matrix
		const int d = upperBound / min_id_cost + std::max(possible_0_inserts, possible_0_deletes);

#ifndef NDEBUG
		std::cout << "d = " << d << '\n';
#endif

		for (int i = 0; i < seqSize + 1; i++) {
			const int startCol = std::max(0, i - d);
			const int endCol = std::min(seqSize, i + d);
			for (int j = startCol; j < endCol + 1; j++) {
				updateDpPosition(i, j, d);
			}
		}
	}